

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

bool __thiscall LinearNE<0,_1,_1>::propagate(LinearNE<0,_1,_1> *this)

{
  BoolView *this_00;
  long *plVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  Lit LVar6;
  Lit *pLVar7;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  Clause *local_48;
  
  this_00 = &this->r;
  bVar2 = BoolView::isFalse(this_00);
  if (bVar2) {
    return true;
  }
  if ((this->num_unfixed).v == 0) {
    if ((this->sum_fixed).v != 0) {
      return true;
    }
    if (so.lazy == true) {
      r._pt = Reason_new(this->sz + 1);
      lVar10 = 0;
      lVar12 = 0;
      while (lVar12 < this->sz) {
        iVar4 = (**(code **)(**(long **)((long)&this->x->var + lVar10) + 0x50))();
        lVar12 = lVar12 + 1;
        pLVar7 = Clause::operator[](r._pt,(int)lVar12);
        pLVar7->x = iVar4;
        lVar10 = lVar10 + 0x10;
      }
    }
    else {
      r._pt = (Clause *)0x0;
    }
    bVar2 = BoolView::setVal(this_00,false,(Reason)r);
    return bVar2;
  }
  bVar2 = BoolView::isTrue(this_00);
  if (!bVar2) {
    return true;
  }
  uVar13 = 0;
  lVar12 = 0;
  do {
    lVar11 = lVar12;
    lVar10 = *(long *)((long)&this->x->var + lVar11);
    lVar12 = lVar11 + 0x10;
    uVar13 = uVar13 - 1;
  } while (*(int *)(lVar10 + 0xc) == *(int *)(lVar10 + 0x10));
  iVar4 = *(int *)&(this->super_Propagator).field_0x14;
  iVar8 = (int)~uVar13;
  if (iVar8 < iVar4) {
    bVar2 = IntView<0>::indomain((IntView<0> *)((long)&this->x->var + lVar11),-(this->sum_fixed).v);
    if (bVar2) goto LAB_00189b21;
    iVar4 = *(int *)&(this->super_Propagator).field_0x14;
  }
  if (iVar8 < iVar4) {
    return true;
  }
  bVar2 = IntView<1>::indomain((IntView<1> *)((long)&this->y->var + lVar11),-(this->sum_fixed).v);
  if (!bVar2) {
    return true;
  }
LAB_00189b21:
  if (so.lazy == true) {
    local_48 = Reason_new(this->sz + 1);
    lVar10 = 0;
    uVar9 = 0;
    while (~uVar13 != uVar9) {
      iVar4 = (**(code **)(**(long **)((long)&this->x->var + lVar10) + 0x50))();
      uVar9 = uVar9 + 1;
      pLVar7 = Clause::operator[](local_48,(int)uVar9);
      pLVar7->x = iVar4;
      lVar10 = lVar10 + 0x10;
    }
    for (iVar4 = -(int)uVar13; iVar4 < this->sz; iVar4 = iVar4 + 1) {
      iVar5 = (**(code **)(**(long **)((long)&this->x->var + lVar12) + 0x50))();
      pLVar7 = Clause::operator[](local_48,iVar4);
      pLVar7->x = iVar5;
      lVar12 = lVar12 + 0x10;
    }
    LVar6 = BoolView::getValLit(this_00);
    pLVar7 = Clause::operator[](local_48,this->sz);
    pLVar7->x = LVar6.x;
  }
  else {
    local_48 = (Clause *)0x0;
  }
  if (iVar8 < *(int *)&(this->super_Propagator).field_0x14) {
    plVar1 = *(long **)((long)&this->x->var + lVar11);
    cVar3 = (**(code **)(*plVar1 + 0x88))(plVar1,-(this->sum_fixed).v,local_48,1);
    if (cVar3 == '\0') {
      return false;
    }
  }
  else {
    plVar1 = *(long **)((long)&this->y->var + lVar11);
    cVar3 = (**(code **)(*plVar1 + 0x88))(plVar1,(this->sum_fixed).v,local_48,1);
    if (cVar3 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		assert(num_unfixed <= 1);

		if (num_unfixed == 0) {
			if (sum_fixed == 0) {
				Clause* m_r = nullptr;
				if (so.lazy) {
					m_r = Reason_new(sz + 1);
					for (int i = 0; i < sz; i++) {
						(*m_r)[i + 1] = x[i].getValLit();
					}
				}
				return r.setVal(false, m_r);
			}
			return true;
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		assert(num_unfixed == 1);

		int k = 0;
		while (x[k].isFixed()) {
			k++;
		}
		assert(k < sz);
		for (int i = k + 1; i < sz; i++) {
			assert(x[i].isFixed());
		}

		if ((k < sp && x[k].remValNotR(-sum_fixed)) || (k >= sp && y[k].remValNotR(-sum_fixed))) {
			Clause* m_r = nullptr;
			if (so.lazy) {
				m_r = Reason_new(sz + R);
				for (int i = 0; i < k; i++) {
					(*m_r)[i + 1] = x[i].getValLit();
				}
				for (int i = k + 1; i < sz; i++) {
					(*m_r)[i] = x[i].getValLit();
				}
				if (R != 0) {
					(*m_r)[sz] = r.getValLit();
				}
			}
			if (k < sp) {
				if (!x[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			} else {
				if (!y[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			}
		}

		return true;
	}